

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsync_semaphore_futex.c
# Opt level: O2

void nsync_mu_semaphore_p(nsync_semaphore *s)

{
  int iVar1;
  int *piVar2;
  int in_R9D;
  bool bVar3;
  
  do {
    while (iVar1 = *(int *)s->sem_space, iVar1 == 0) {
      iVar1 = futex((int *)s,0x189,0,(timespec *)0x0,(int *)0xffffffff,in_R9D);
      if (iVar1 != 0) {
        piVar2 = __errno_location();
        if ((*piVar2 != 4) && (*piVar2 != 0xb)) {
          _DAT_00000000 = 0;
        }
      }
    }
    LOCK();
    bVar3 = iVar1 == *(int *)s->sem_space;
    if (bVar3) {
      *(int *)s->sem_space = iVar1 + -1;
    }
    UNLOCK();
  } while (!bVar3);
  return;
}

Assistant:

void nsync_mu_semaphore_p (nsync_semaphore *s) {
	struct futex *f = (struct futex *) s;
	int i;
	do {
		i = ATM_LOAD ((nsync_atomic_uint32_ *) &f->i);
		if (i == 0) {
                        int futex_result = futex (&f->i, FUTEX_WAIT_, i, NULL,
                                                  NULL, FUTEX_WAIT_BITS_);
			ASSERT (futex_result == 0 || errno == EINTR ||
				errno == EWOULDBLOCK);
		}
	} while (i == 0 || !ATM_CAS_ACQ ((nsync_atomic_uint32_ *) &f->i, i, i-1));
}